

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

undefined8 __thiscall
LatencyDumpDefaultImpl::dump_abi_cxx11_
          (LatencyDumpDefaultImpl *this,MapWrapper *map_w,LatencyCollectorDumpOptions *opt)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  pointer ppVar4;
  void *pvVar5;
  ulong uVar6;
  size_type sVar7;
  ostream *this_00;
  uint64_t uVar8;
  reference ppVar9;
  int *in_RCX;
  MapWrapper *in_RDX;
  LatencyDump *in_RSI;
  undefined8 in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_LatencyItem_*>_>::value,_pair<iterator,_bool>_>
  _Var10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry_4;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1_2;
  LatencyItem *item_3;
  pair<const_unsigned_long,_LatencyItem_*> *entry_3;
  iterator __end2_1;
  iterator __begin2_1;
  multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  *__range2_1;
  LatencyItem *item_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry_2;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range2;
  LatencyItem *item_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1_1;
  LatencyItem *new_item;
  LatencyItem *item_found;
  iterator existing;
  string actual_name;
  LatencyItem *item;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *map;
  size_t max_name_len;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  map_string;
  multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  map_uint64_t;
  stringstream ss;
  LatencyItem *in_stack_fffffffffffffb68;
  LatencyItem *pLVar11;
  LatencyItem *in_stack_fffffffffffffb70;
  LatencyItem *in_stack_fffffffffffffb78;
  LatencyItem *in_stack_fffffffffffffb80;
  multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
  *in_stack_fffffffffffffb88;
  MapWrapper *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  _Self local_3b8;
  _Self local_3b0;
  undefined1 *local_3a8;
  string local_3a0 [32];
  LatencyItem *local_380;
  reference local_378;
  _Self local_370;
  _Self local_368;
  undefined1 *local_360;
  string local_358 [32];
  LatencyItem *local_338;
  reference local_330;
  _Self local_328;
  _Self local_320;
  undefined1 *local_318;
  LatencyItem *local_310;
  reference local_308;
  _Self local_300;
  _Self local_2f8;
  undefined1 *local_2f0;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  void *local_2b0;
  LatencyItem *local_2a8;
  _Self local_2a0;
  _Self local_298;
  string local_290 [32];
  string local_270 [32];
  LatencyItem *local_250;
  reference local_248;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_240;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_238;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *local_230;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *local_228;
  ulong local_220;
  undefined1 local_218 [48];
  undefined1 local_1e8 [48];
  undefined4 local_1b8;
  stringstream local_1a8 [16];
  ostream local_198 [239];
  undefined1 in_stack_ffffffffffffff57;
  uint64_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  LatencyItem *in_stack_ffffffffffffff68;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar2 = MapWrapper::getSize(in_stack_fffffffffffffb90);
  if (sVar2 == 0) {
    poVar3 = std::operator<<(local_198,"# stats: ");
    sVar2 = MapWrapper::getSize(in_stack_fffffffffffffb90);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    local_1b8 = 1;
  }
  else {
    std::
    multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
    ::multimap((multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
                *)0x10a457);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
           *)0x10a464);
    local_220 = 9;
    local_230 = LatencyDump::getMap_abi_cxx11_(in_RSI,in_RDX);
    local_228 = local_230;
    local_238._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                  *)in_stack_fffffffffffffb68);
    local_240._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                *)in_stack_fffffffffffffb68);
    while (bVar1 = std::__detail::operator!=(&local_238,&local_240), bVar1) {
      local_248 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                  ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                               *)0x10a504);
      local_250 = local_248->second;
      uVar8 = LatencyItem::getNumCalls((LatencyItem *)0x10a52d);
      if (uVar8 != 0) {
        LatencyItem::getName_abi_cxx11_(in_stack_fffffffffffffb68);
        getActualFunction((string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                          SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0));
        std::__cxx11::string::~string(local_290);
        local_298._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                     *)in_stack_fffffffffffffb68,(key_type *)0x10a5b5);
        local_2a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                    *)in_stack_fffffffffffffb68);
        bVar1 = std::operator!=(&local_298,&local_2a0);
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                                 *)in_stack_fffffffffffffb70);
          local_2a8 = ppVar4->second;
          LatencyItem::operator+=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        }
        else {
          pvVar5 = operator_new(0x50);
          LatencyItem::LatencyItem(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          local_2b0 = pvVar5;
          std::make_pair<std::__cxx11::string&,LatencyItem*&>
                    (&in_stack_fffffffffffffb78->statName,(LatencyItem **)in_stack_fffffffffffffb70)
          ;
          _Var10 = std::
                   map<std::__cxx11::string,LatencyItem*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
                   ::insert<std::pair<std::__cxx11::string,LatencyItem*>>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                               *)in_stack_fffffffffffffb80,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
                               *)in_stack_fffffffffffffb78);
          local_2e8 = (_Base_ptr)_Var10.first._M_node;
          in_stack_fffffffffffffbdf = _Var10.second;
          local_2e0 = in_stack_fffffffffffffbdf;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
                   *)0x10a712);
        }
        uVar6 = std::__cxx11::string::size();
        if (local_220 < uVar6) {
          local_220 = std::__cxx11::string::size();
        }
        std::__cxx11::string::~string(local_270);
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                    *)in_stack_fffffffffffffb70);
    }
    poVar3 = std::operator<<(local_198,"# stats: ");
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                    *)0x10a7df);
    this_00 = (ostream *)std::ostream::operator<<(poVar3,sVar7);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_2f0 = local_218;
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                  *)in_stack_fffffffffffffb68);
    local_300._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                *)in_stack_fffffffffffffb68);
    while (bVar1 = std::operator!=(&local_2f8,&local_300), bVar1) {
      local_308 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                               *)0x10a86b);
      local_310 = local_308->second;
      uVar8 = LatencyItem::getNumCalls((LatencyItem *)0x10a894);
      if (uVar8 != 0) {
        switch(*in_RCX) {
        case 0:
          break;
        case 1:
          LatencyItem::getTotalTime((LatencyItem *)0x10a8eb);
          addToUintMap((uint64_t)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                       in_stack_fffffffffffffb80);
          break;
        case 2:
          LatencyItem::getNumCalls((LatencyItem *)0x10a91d);
          addToUintMap((uint64_t)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                       in_stack_fffffffffffffb80);
          break;
        case 3:
          LatencyItem::getAvgLatency((LatencyItem *)0x10a94f);
          addToUintMap((uint64_t)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                       in_stack_fffffffffffffb80);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                    *)in_stack_fffffffffffffb70);
    }
    addDumpTitle((stringstream *)poVar3,(size_t)this_00);
    if (*in_RCX == 0) {
      local_318 = local_218;
      local_320._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                    *)in_stack_fffffffffffffb68);
      local_328._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                  *)in_stack_fffffffffffffb68);
      while (bVar1 = std::operator!=(&local_320,&local_328), bVar1) {
        local_330 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                                 *)0x10aa15);
        local_338 = local_330->second;
        uVar8 = LatencyItem::getNumCalls((LatencyItem *)0x10aa3e);
        if (uVar8 != 0) {
          poVar3 = local_198;
          dumpItem_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
          poVar3 = std::operator<<(poVar3,local_358);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_358);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                      *)in_stack_fffffffffffffb70);
      }
    }
    else {
      local_360 = local_1e8;
      local_368._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
           ::begin((multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
                    *)in_stack_fffffffffffffb68);
      local_370._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
           ::end((multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
                  *)in_stack_fffffffffffffb68);
      while (bVar1 = std::operator!=(&local_368,&local_370), bVar1) {
        local_378 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_LatencyItem_*>_>::
                    operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_LatencyItem_*>_> *)
                              0x10ab65);
        local_380 = local_378->second;
        uVar8 = LatencyItem::getNumCalls((LatencyItem *)0x10ab8e);
        if (uVar8 != 0) {
          poVar3 = local_198;
          dumpItem_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
          in_stack_fffffffffffffb70 = (LatencyItem *)std::operator<<(poVar3,local_3a0);
          std::ostream::operator<<
                    ((ostream *)in_stack_fffffffffffffb70,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_3a0);
        }
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_LatencyItem_*>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_LatencyItem_*>_> *)
                   in_stack_fffffffffffffb70);
      }
    }
    local_3a8 = local_218;
    local_3b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                  *)in_stack_fffffffffffffb68);
    local_3b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                *)in_stack_fffffffffffffb68);
    while (bVar1 = std::operator!=(&local_3b0,&local_3b8), bVar1) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                            *)0x10acaf);
      pLVar11 = ppVar9->second;
      if (pLVar11 != (LatencyItem *)0x0) {
        LatencyItem::~LatencyItem(in_stack_fffffffffffffb70);
        operator_delete(pLVar11);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>
                    *)in_stack_fffffffffffffb70);
    }
    std::__cxx11::stringstream::str();
    local_1b8 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
            *)0x10ad1f);
    std::
    multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
    ::~multimap((multimap<unsigned_long,_LatencyItem_*,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_LatencyItem_*>_>_>
                 *)0x10ad2c);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string dump(MapWrapper* map_w,
                     const LatencyCollectorDumpOptions& opt) {
        std::stringstream ss;
        if (!map_w->getSize()) {
            ss << "# stats: " << map_w->getSize() << std::endl;
            return ss.str();
        }

        std::multimap<uint64_t,
                      LatencyItem*,
                      std::greater<uint64_t> > map_uint64_t;
        std::map<std::string, LatencyItem*> map_string;
        size_t max_name_len = 9; // reserved for "STAT NAME" 9 chars

        std::unordered_map<std::string, LatencyItem*>& map = getMap(map_w);

        // Deduplication
        for (auto& entry: map) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) {
                continue;
            }
            std::string actual_name = getActualFunction(item->getName(), false);

            auto existing = map_string.find(actual_name);
            if (existing != map_string.end()) {
                LatencyItem* item_found = existing->second;
                *item_found += *item;
            } else {
                LatencyItem* new_item = new LatencyItem(*item);
                map_string.insert( std::make_pair(actual_name, new_item) );
            }

            if (actual_name.size() > max_name_len) {
                max_name_len = actual_name.size();
            }
        }

        ss << "# stats: " << map_string.size() << std::endl;

        for (auto& entry: map_string) {
            LatencyItem *item = entry.second;
            if (!item->getNumCalls()) continue;

            switch (opt.sort_by) {
            case LatencyCollectorDumpOptions::NAME: {
                // Do nothing
                break;
            }

            // Otherwise: dealing with uint64_t, map_uint64_t.
            case LatencyCollectorDumpOptions::TOTAL_TIME:
                addToUintMap(item->getTotalTime(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::NUM_CALLS:
                addToUintMap(item->getNumCalls(), map_uint64_t, item);
                break;

            case LatencyCollectorDumpOptions::AVG_LATENCY:
                addToUintMap(item->getAvgLatency(), map_uint64_t, item);
                break;
            }
        }

        addDumpTitle(ss, max_name_len);

        if (opt.sort_by == LatencyCollectorDumpOptions::NAME) {
            // Name (string)
            for (auto& entry: map_string) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        } else {
            // Otherwise (number)
            for (auto& entry: map_uint64_t) {
                LatencyItem *item = entry.second;
                if (item->getNumCalls()) {
                    ss << dumpItem(item, max_name_len, 0, false)
                       << std::endl;
                }
            }
        }

        // Free all.
        for (auto& entry: map_string) {
            delete entry.second;
        }

        return ss.str();
    }